

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Type_Tag.cpp
# Opt level: O2

ostream * psy::C::operator<<(ostream *os,TagType *tagTy)

{
  ostream *poVar1;
  string sStack_38;
  
  if (tagTy != (TagType *)0x0) {
    std::operator<<(os,"<TagType | ");
    operator<<(os,(TagTypeKind)
                  ((ushort)*(undefined2 *)
                            &((tagTy->super_Type).impl_._M_t.
                              super___uniq_ptr_impl<psy::C::Type::TypeImpl,_std::default_delete<psy::C::Type::TypeImpl>_>
                              ._M_t.
                              super__Tuple_impl<0UL,_psy::C::Type::TypeImpl_*,_std::default_delete<psy::C::Type::TypeImpl>_>
                              .super__Head_base<0UL,_psy::C::Type::TypeImpl_*,_false>._M_head_impl)
                             ->field_0 >> 0xb) & (Enum|Union));
    poVar1 = std::operator<<(os," tag:");
    Lexeme::valueText_abi_cxx11_
              (&sStack_38,
               *(Lexeme **)
                ((tagTy->super_Type).impl_._M_t.
                 super___uniq_ptr_impl<psy::C::Type::TypeImpl,_std::default_delete<psy::C::Type::TypeImpl>_>
                 ._M_t.
                 super__Tuple_impl<0UL,_psy::C::Type::TypeImpl_*,_std::default_delete<psy::C::Type::TypeImpl>_>
                 .super__Head_base<0UL,_psy::C::Type::TypeImpl_*,_false>._M_head_impl + 2));
    std::operator<<(poVar1,(string *)&sStack_38);
    std::__cxx11::string::~string((string *)&sStack_38);
    std::operator<<(os,">");
    return os;
  }
  poVar1 = std::operator<<(os,"<TagType is null>");
  return poVar1;
}

Assistant:

PSY_C_API std::ostream& operator<<(std::ostream& os, const TagType* tagTy)
{
    if (!tagTy)
        return os << "<TagType is null>";
    os << "<TagType | ";
    os << tagTy->kind();
    os << " tag:" << tagTy->tag()->valueText();
    os << ">";
    return os;
}